

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfile.hh
# Opt level: O2

void __thiscall
helix::nasdaq::binaryfile_session<helix::nasdaq::itch50_handler>::register_callback
          (binaryfile_session<helix::nasdaq::itch50_handler> *this,event_callback *callback)

{
  function<void_(const_helix::event_&)> local_30;
  
  std::function<void_(const_helix::event_&)>::function(&local_30,callback);
  itch50_handler::register_callback(&this->_handler,&local_30);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return;
}

Assistant:

void binaryfile_session<Handler>::register_callback(event_callback callback)
{
    _handler.register_callback(callback);
}